

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.h
# Opt level: O0

int __thiscall uWS::Loop::init(Loop *this,EVP_PKEY_CTX *ctx)

{
  LoopData *in_stack_00000050;
  
  us_loop_ext();
  LoopData::LoopData(in_stack_00000050);
  return (int)this;
}

Assistant:

Loop *init() {
        new (us_loop_ext((us_loop_t *) this)) LoopData;
        return this;
    }